

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O1

void __thiscall ProblemTest_MutObjective_Test::TestBody(ProblemTest_MutObjective_Test *this)

{
  pointer pBVar1;
  pointer pLVar2;
  bool bVar3;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  int *expected;
  ExprBase *actual;
  MutObjective MVar8;
  AssertionResult gtest_ar;
  double coefs [1];
  int num_terms;
  int indices [1];
  NumericConstant expr;
  Problem p;
  AssertHelper local_3d8;
  AssertHelper local_3d0;
  Term local_3c8;
  ExprBase local_3b8;
  AssertHelper local_3b0;
  int local_3a8 [2];
  long local_3a0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_398;
  NumericConstant local_390;
  BasicProblem<mp::BasicProblemParams<int>_> local_388;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&local_388);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj(&local_388,MIN,(NumericExpr)0x0,0);
  MVar8 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&local_388,0);
  pBVar4 = MVar8.
           super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_390 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                        (&local_388.super_ExprFactory,42.0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::SetNonlinearObjExpr
            (pBVar4,MVar8.
                    super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                    .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_,
             (NumericExpr)
             local_390.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_);
  uVar5 = (ulong)MVar8.
                 super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  pBVar1 = (pBVar4->nonlinear_objs_).
           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar5 < (ulong)((long)(pBVar4->nonlinear_objs_).
                            super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3)) {
    local_3b8.impl_ = pBVar1[uVar5].super_ExprBase.impl_;
  }
  else {
    local_3b8.impl_ = (Impl *)0x0;
  }
  actual = &local_3b8;
  testing::internal::
  CmpHelperEQ<mp::NumericConstant,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((internal *)&local_3c8,"expr","obj.nonlinear_expr()",&local_390,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)actual);
  if ((char)local_3c8.var_index_ == '\0') {
    testing::Message::Message((Message *)&local_3b8);
    if ((undefined8 *)local_3c8.coef_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_3c8.coef_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x11e,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    if (local_3b8.impl_ != (Impl *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_3b8.impl_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_3b8.impl_ + 8))();
      }
      local_3b8.impl_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8.coef_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3c8.var_index_ = 0xb;
  local_3c8.coef_ = (double)&DAT_400199999999999a;
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::
  append_element<mp::LinearExpr::Term>
            ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
             ((pBVar4->linear_objs_).
              super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
              super__Vector_impl_data._M_start + uVar5),&local_3c8);
  local_3a8[1] = 0xb;
  local_3b8.impl_ = (Impl *)&DAT_400199999999999a;
  local_3a8[0] = 1;
  local_3d0.data_._0_4_ =
       *(undefined4 *)
        ((long)&(pBVar4->linear_objs_).
                super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5].terms_.
                super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data + 0x10);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_3c8,"num_terms","obj.linear_expr().num_terms()",local_3a8,
             (int *)&local_3d0);
  if ((char)local_3c8.var_index_ == '\0') {
    testing::Message::Message((Message *)&local_3d0);
    if ((undefined8 *)local_3c8.coef_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_3c8.coef_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x122,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_3d0.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_3d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3d0.data_ + 8))();
      }
      local_3d0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8.coef_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3d0.data_ =
       *(AssertHelperData **)
        &(pBVar4->linear_objs_).super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar5].terms_.
         super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data;
  local_3a0 = uVar5 * 0x78;
  local_398 = pBVar4;
  if (0 < local_3a8[0]) {
    expected = local_3a8;
    lVar6 = 0;
    do {
      expected = expected + 1;
      local_3d8.data_._0_4_ = (local_3d0.data_)->type;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_3c8,"indices[i]","it->var_index()",expected,(int *)&local_3d8);
      if ((char)local_3c8.var_index_ == '\0') {
        testing::Message::Message((Message *)&local_3d8);
        pcVar7 = "";
        if ((undefined8 *)local_3c8.coef_ != (undefined8 *)0x0) {
          pcVar7 = *(char **)local_3c8.coef_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_3b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc"
                   ,0x122,pcVar7);
        testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3d8);
        testing::internal::AssertHelper::~AssertHelper(&local_3b0);
        if (local_3d8.data_ != (AssertHelperData *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (local_3d8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_3d8.data_ + 8))();
          }
          local_3d8.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_3c8.coef_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_3d8.data_ = (AssertHelperData *)(local_3d0.data_)->file;
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_3c8,"coefs[i]","it->coef()",(double *)actual,
                 (double *)&local_3d8);
      if ((char)local_3c8.var_index_ == '\0') {
        testing::Message::Message((Message *)&local_3d8);
        pcVar7 = "";
        if ((undefined8 *)local_3c8.coef_ != (undefined8 *)0x0) {
          pcVar7 = *(char **)local_3c8.coef_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_3b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc"
                   ,0x122,pcVar7);
        testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3d8);
        testing::internal::AssertHelper::~AssertHelper(&local_3b0);
        if (local_3d8.data_ != (AssertHelperData *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (local_3d8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_3d8.data_ + 8))();
          }
          local_3d8.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_3c8.coef_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar6 = lVar6 + 1;
      local_3d0.data_ = (AssertHelperData *)&(local_3d0.data_)->line;
      actual = actual + 1;
    } while (lVar6 < local_3a8[0]);
  }
  pBVar4 = local_398;
  lVar6 = local_3a0;
  pLVar2 = (local_398->linear_objs_).
           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_3d8.data_ =
       (AssertHelperData *)
       (*(long *)((long)&(pLVar2->terms_).
                         super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data +
                 local_3a0 + 0x10) * 0x10 +
       *(long *)((long)&(pLVar2->terms_).
                        super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data +
                local_3a0));
  testing::internal::
  CmpHelperEQ<gch::small_vector_iterator<mp::LinearExpr::Term*,long>,gch::small_vector_iterator<mp::LinearExpr::Term_const*,long>>
            ((internal *)&local_3c8,"obj.linear_expr().end()","it",
             (small_vector_iterator<mp::LinearExpr::Term_*,_long> *)&local_3d8,
             (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)&local_3d0);
  if ((char)local_3c8.var_index_ == '\0') {
    testing::Message::Message((Message *)&local_3d8);
    if ((undefined8 *)local_3c8.coef_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_3c8.coef_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x122,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3d8.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_3d8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3d8.data_ + 8))();
      }
      local_3d8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8.coef_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3d0.data_._0_4_ = 1;
  local_3d8.data_._0_4_ =
       *(undefined4 *)
        ((long)&(((pBVar4->linear_objs_).
                  super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                  super__Vector_impl_data._M_start)->terms_).
                super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data +
        lVar6 + 0x10);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_3c8,"1","obj.linear_expr().num_terms()",(int *)&local_3d0,
             (int *)&local_3d8);
  if ((char)local_3c8.var_index_ == '\0') {
    testing::Message::Message((Message *)&local_3d0);
    if ((undefined8 *)local_3c8.coef_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_3c8.coef_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x123,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_3d0.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_3d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3d0.data_ + 8))();
      }
      local_3d0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8.coef_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&local_388,0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_388);
  return;
}

Assistant:

TEST(ProblemTest, MutObjective) {
  Problem p;
  p.AddObj(mp::obj::MIN);
  Problem::MutObjective obj = p.obj(0);
  auto expr = p.MakeNumericConstant(42);
  obj.set_nonlinear_expr(expr);
  EXPECT_EQ(expr, obj.nonlinear_expr());
  obj.linear_expr().AddTerm(11, 2.2);
  const int indices[] = {11};
  const double coefs[] = {2.2};
  EXPECT_LINEAR_EXPR(obj.linear_expr(), indices, coefs);
  EXPECT_EQ(1, obj.linear_expr().num_terms());
  const Problem &cp = p;
  Problem::Objective cobj = cp.obj(0);
  cobj = obj;
}